

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall CClient::InitInterfaces(CClient *this)

{
  IKernel *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  IConfigManager *pIVar3;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_08;
  
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"engine");
  this->m_pEngine = (IEngine *)CONCAT44(extraout_var,iVar2);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"editor");
  this->m_pEditor = (IEditor *)CONCAT44(extraout_var_00,iVar2);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"enginesound");
  this->m_pSound = (IEngineSound *)CONCAT44(extraout_var_01,iVar2);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"enginetextrender");
  this->m_pTextRender = (IEngineTextRender *)CONCAT44(extraout_var_02,iVar2);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"gameclient");
  this->m_pGameClient = (IGameClient *)CONCAT44(extraout_var_03,iVar2);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"engineinput");
  this->m_pInput = (IEngineInput *)CONCAT44(extraout_var_04,iVar2);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"enginemap");
  this->m_pMap = (IEngineMap *)CONCAT44(extraout_var_05,iVar2);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"mapchecker");
  this->m_pMapChecker = (IMapChecker *)CONCAT44(extraout_var_06,iVar2);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"enginemasterserver");
  this->m_pMasterServer = (IEngineMasterServer *)CONCAT44(extraout_var_07,iVar2);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"config");
  pIVar3 = (IConfigManager *)CONCAT44(extraout_var_08,iVar2);
  this->m_pConfigManager = pIVar3;
  iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[6])(pIVar3);
  this->m_pConfig = (CConfig *)CONCAT44(extraout_var_09,iVar2);
  pIVar1 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"storage");
  this->m_pStorage = (IStorage *)CONCAT44(extraout_var_10,iVar2);
  iVar2 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x13])();
  CServerBrowser::Init
            (&this->m_ServerBrowser,&this->m_ContactClient,(char *)CONCAT44(extraout_var_11,iVar2));
  CFriends::Init(&this->m_Friends);
  CBlacklist::Init(&this->m_Blacklist);
  CDemoRecorder::Init(&this->m_DemoRecorder,this->m_pConsole,this->m_pStorage);
  CDemoPlayer::Init(&this->m_DemoPlayer,this->m_pConsole,this->m_pStorage);
  return;
}

Assistant:

void CClient::InitInterfaces()
{
	// fetch interfaces
	m_pEngine = Kernel()->RequestInterface<IEngine>();
	m_pEditor = Kernel()->RequestInterface<IEditor>();
	//m_pGraphics = Kernel()->RequestInterface<IEngineGraphics>();
	m_pSound = Kernel()->RequestInterface<IEngineSound>();
	m_pTextRender = Kernel()->RequestInterface<IEngineTextRender>();
	m_pGameClient = Kernel()->RequestInterface<IGameClient>();
	m_pInput = Kernel()->RequestInterface<IEngineInput>();
	m_pMap = Kernel()->RequestInterface<IEngineMap>();
	m_pMapChecker = Kernel()->RequestInterface<IMapChecker>();
	m_pMasterServer = Kernel()->RequestInterface<IEngineMasterServer>();
	m_pConfigManager = Kernel()->RequestInterface<IConfigManager>();
	m_pConfig = m_pConfigManager->Values();
	m_pStorage = Kernel()->RequestInterface<IStorage>();

	//
	m_ServerBrowser.Init(&m_ContactClient, m_pGameClient->NetVersion());
	m_Friends.Init();
	m_Blacklist.Init();
	m_DemoRecorder.Init(Console(), m_pStorage);
	m_DemoPlayer.Init(Console(), m_pStorage);
}